

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  long *plVar1;
  uint *puVar2;
  byte bVar3;
  Tolerances *pTVar4;
  Real RVar5;
  double dVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ostream *poVar12;
  long lVar13;
  undefined3 in_register_00000081;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  char *pcVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  ofstream outfile;
  undefined8 local_3c8;
  int local_3bc;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3b8;
  ulong local_3a0;
  long local_398;
  undefined4 local_38c;
  data_type local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined5 local_358;
  char cStack_353;
  char cStack_352;
  undefined6 uStack_351;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  pointer local_308;
  uint auStack_300 [2];
  uint local_2f8 [2];
  uint auStack_2f0 [2];
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  int local_2d8;
  bool local_2d4;
  fpclass_type local_2d0;
  int32_t iStack_2cc;
  long local_2c0;
  pointer local_2b8;
  pointer pnStack_2b0;
  pointer local_2a8;
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288 [2];
  uint auStack_280 [2];
  pointer local_278;
  pointer pnStack_270;
  pointer local_268;
  uint auStack_260 [2];
  uint local_258 [2];
  uint auStack_250 [2];
  uint local_248 [2];
  uint auStack_240 [4];
  long local_230;
  filebuf local_228 [8];
  long lStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  local_38c = CONCAT31(in_register_00000081,real);
  pTVar4 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var14 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
  dVar6 = log10(RVar5);
  local_338._8_4_ = extraout_XMM0_Dc;
  local_338._0_8_ = dVar6;
  local_338._12_4_ = extraout_XMM0_Dd;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  local_3a0 = (ulong)(uint)(int)-(double)local_338._0_8_;
  local_3bc = (int)-(double)local_338._0_8_ + 10;
  local_338._0_8_ = colnames;
  if ((char)rownames == '\0') goto LAB_0013b9e3;
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_3b8,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar8 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getPrimalRay(soplex,&local_3b8);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_3c8 = (long)local_3bc;
      local_398 = (long)(int)local_3a0;
      lVar13 = 0;
      lVar15 = 0;
      do {
        plVar1 = (long *)((long)((local_3b8.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar13);
        local_278 = (pointer)*plVar1;
        pnStack_270 = (pointer)plVar1[1];
        puVar2 = (uint *)((long)((local_3b8.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar13 + 0x10);
        local_268 = *(pointer *)puVar2;
        auStack_260 = *(uint (*) [2])(puVar2 + 2);
        puVar2 = (uint *)((long)((local_3b8.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar13 + 0x20);
        local_258 = *(uint (*) [2])puVar2;
        auStack_250 = *(uint (*) [2])(puVar2 + 2);
        puVar2 = (uint *)((long)((local_3b8.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar13 + 0x30);
        local_248 = *(uint (*) [2])puVar2;
        auStack_240._0_8_ = *(undefined8 *)(puVar2 + 2);
        iVar9 = *(int *)((long)(&((local_3b8.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                        + lVar13);
        bVar3 = *(byte *)((long)(&((local_3b8.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                         + lVar13 + 4);
        local_328 = *(long *)((long)(&((local_3b8.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                    + 1) + lVar13 + 8);
        uStack_320 = 0;
        pTVar4 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (soplex->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
        local_2e8[0] = local_248[0];
        local_2e8[1] = local_248[1];
        auStack_2e0[0] = auStack_240[0];
        auStack_2e0[1] = auStack_240[1];
        local_2f8[0] = local_258[0];
        local_2f8[1] = local_258[1];
        auStack_2f0[0] = auStack_250[0];
        auStack_2f0[1] = auStack_250[1];
        local_308 = local_268;
        auStack_300[0] = auStack_260[0];
        auStack_300[1] = auStack_260[1];
        local_318._0_8_ = local_278;
        uVar7 = local_318._0_8_;
        local_318._8_8_ = pnStack_270;
        local_2d0 = (fpclass_type)local_328;
        iStack_2cc = local_328._4_4_;
        local_2d4 = (bool)bVar3;
        if ((bVar3 != 0) &&
           (local_318._0_4_ = SUB84(local_278,0),
           local_318._0_4_ != 0 || (fpclass_type)local_328 != cpp_dec_float_finite)) {
          local_2d4 = (bool)(bVar3 ^ 1);
        }
        bVar8 = false;
        local_318._0_8_ = uVar7;
        local_2d8 = iVar9;
        if (((fpclass_type)local_328 != cpp_dec_float_NaN) && (!NAN(RVar5))) {
          local_340 = 0x1000000000;
          local_388.double_first = 0;
          local_378 = (undefined1  [16])0x0;
          local_368 = (undefined1  [16])0x0;
          local_358 = 0;
          cStack_353 = '\0';
          cStack_352 = '\0';
          uStack_351 = 0;
          uStack_34b = 0;
          uStack_348 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar5);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_318,
                             (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
          bVar8 = 0 < iVar9;
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        if (bVar8) {
          if (*(long *)(local_338._0_8_ + 0x20) == 0) {
            std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x198);
          }
          else {
            pcVar16 = (char *)(*(long *)(local_338._0_8_ + 0x20) +
                              (long)*(int *)(*(long *)local_338._0_8_ +
                                            (long)*(int *)(*(long *)(local_338._0_8_ + 8) + 4 +
                                                          lVar15 * 8) * 8));
            sVar11 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar16,sVar11)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_3c8;
          *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_398;
          poVar12 = boost::multiprecision::operator<<
                              ((ostream *)&local_230,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)((local_3b8.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar13));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        lVar15 = lVar15 + 1;
        lVar13 = lVar13 + 0x50;
      } while (lVar15 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"All other entries are zero (within ",0x23);
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
    *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
    pTVar4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = (soplex->_tolerances).
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
    poVar12 = std::ostream::_M_insert<double>(RVar5);
    lVar13 = *(long *)poVar12;
    *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
    lVar13 = *(long *)(lVar13 + -0x18);
    *(uint *)(poVar12 + lVar13 + 0x18) = *(uint *)(poVar12 + lVar13 + 0x18) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
LAB_0013b9bf:
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
  }
  else {
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar8 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimal(soplex,&local_3b8), bVar8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        local_3c8 = (ulong)local_3c8._4_4_ << 0x20;
      }
      else {
        local_398 = (long)local_3bc;
        local_2c0 = (long)(int)local_3a0;
        lVar13 = 0;
        lVar15 = 0;
        local_3c8 = (ulong)local_3c8._4_4_ << 0x20;
        do {
          plVar1 = (long *)((long)((local_3b8.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13);
          local_2b8 = (pointer)*plVar1;
          pnStack_2b0 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)((local_3b8.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13 + 0x10);
          local_2a8 = *(pointer *)puVar2;
          auStack_2a0 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)((local_3b8.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13 + 0x20);
          local_298 = *(uint (*) [2])puVar2;
          auStack_290 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)((local_3b8.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                  _M_elems + lVar13 + 0x30);
          local_288 = *(uint (*) [2])puVar2;
          auStack_280 = *(uint (*) [2])(puVar2 + 2);
          iVar9 = *(int *)((long)(&((local_3b8.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1
                                 ) + lVar13);
          bVar3 = *(byte *)((long)(&((local_3b8.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                                  1) + lVar13 + 4);
          local_328 = *(long *)((long)(&((local_3b8.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                        data + 1) + lVar13 + 8);
          uStack_320 = 0;
          pTVar4 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var14 = (soplex->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
          local_2e8[0] = local_288[0];
          local_2e8[1] = local_288[1];
          auStack_2e0[0] = auStack_280[0];
          auStack_2e0[1] = auStack_280[1];
          local_2f8[0] = local_298[0];
          local_2f8[1] = local_298[1];
          auStack_2f0[0] = auStack_290[0];
          auStack_2f0[1] = auStack_290[1];
          local_308 = local_2a8;
          auStack_300[0] = auStack_2a0[0];
          auStack_300[1] = auStack_2a0[1];
          local_318._0_8_ = local_2b8;
          uVar7 = local_318._0_8_;
          local_318._8_8_ = pnStack_2b0;
          local_2d0 = (fpclass_type)local_328;
          iStack_2cc = local_328._4_4_;
          local_2d4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_318._0_4_ = SUB84(local_2b8,0),
             local_318._0_4_ != 0 || (fpclass_type)local_328 != cpp_dec_float_finite)) {
            local_2d4 = (bool)(bVar3 ^ 1);
          }
          bVar8 = false;
          local_318._0_8_ = uVar7;
          local_2d8 = iVar9;
          if (((fpclass_type)local_328 != cpp_dec_float_NaN) && (!NAN(RVar5))) {
            local_340 = 0x1000000000;
            local_388.double_first = 0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = 0;
            cStack_353 = '\0';
            cStack_352 = '\0';
            uStack_351 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar5);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_318,
                               (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
            bVar8 = 0 < iVar9;
          }
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if (bVar8) {
            if (*(long *)(local_338._0_8_ + 0x20) == 0) {
              std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x198);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_338._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_338._0_8_ +
                                              (long)*(int *)(*(long *)(local_338._0_8_ + 8) + 4 +
                                                            lVar15 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_398;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_2c0;
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)((local_3b8.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           data._M_elems + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            local_3c8 = CONCAT44(local_3c8._4_4_,(int)local_3c8 + 1);
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x50;
        } while (lVar15 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero (within ",0x25);
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      pTVar4 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = (soplex->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      RVar5 = ::soplex::Tolerances::epsilon(pTVar4);
      poVar12 = std::ostream::_M_insert<double>(RVar5);
      lVar13 = *(long *)poVar12;
      *(undefined8 *)(poVar12 + *(long *)(lVar13 + -0x18) + 8) = 8;
      lVar13 = *(long *)(lVar13 + -0x18);
      *(uint *)(poVar12 + lVar13 + 0x18) = *(uint *)(poVar12 + lVar13 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"). Solution has ",0x10);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      goto LAB_0013b9bf;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"No primal information available.\n",0x21);
  }
  if (local_3b8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0013b9e3:
  if ((char)local_38c != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_318,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar8 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)local_318);
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_328 = (long)local_3bc;
        local_3c8 = (long)(int)local_3a0;
        lVar13 = 0;
        lVar15 = 0;
        do {
          uVar7 = local_318._0_8_;
          local_3b8.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3b8,(type *)0x0);
          iVar9 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)uVar7)->m_value).num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar13),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar9 != 0) {
            if (*(long *)(local_338._0_8_ + 0x20) == 0) {
              std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x198);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_338._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_338._0_8_ +
                                              (long)*(int *)(*(long *)(local_338._0_8_ + 8) + 4 +
                                                            lVar15 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&lStack_220 + *(long *)(local_230 + -0x18)) = local_328;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = local_3c8;
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_318._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x40;
        } while (lVar15 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other entries are zero.",0x1b);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar8 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                            *)local_318), bVar8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum < 1) {
        iVar9 = 0;
      }
      else {
        lVar15 = 0;
        lVar13 = 0;
        iVar9 = 0;
        do {
          uVar7 = local_318._0_8_;
          local_3b8.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3b8,(type *)0x0);
          iVar10 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar7)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar15),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar10 != 0) {
            if (*(long *)(local_338._0_8_ + 0x20) == 0) {
              std::ios::clear((int)&local_3c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x198);
            }
            else {
              pcVar16 = (char *)(*(long *)(local_338._0_8_ + 0x20) +
                                (long)*(int *)(*(long *)local_338._0_8_ +
                                              (long)*(int *)(*(long *)(local_338._0_8_ + 8) + 4 +
                                                            lVar13 * 8) * 8));
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            poVar12 = boost::multiprecision::operator<<
                                ((ostream *)&local_230,
                                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_318._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar15));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            iVar9 = iVar9 + 1;
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0x40;
        } while (lVar13 < (soplex->_rationalLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero. Solution has ",0x2b);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"No primal (rational) solution available.\n",0x29);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_318);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}